

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O2

void __thiscall
DISABLED_RecoveryTest_StackOverflowTest_Test::TestBody
          (DISABLED_RecoveryTest_StackOverflowTest_Test *this)

{
  bool bVar1;
  DeathTest *pDVar2;
  bool bVar3;
  int iVar4;
  char *message;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  AssertHelper local_e0 [4];
  RE local_c0;
  
  bVar3 = testing::internal::AlwaysTrue();
  if (!bVar3) goto LAB_0010c88b;
  testing::internal::RE::Init(&local_c0,"::adfadf");
  bVar3 = testing::internal::DeathTest::Create
                    ("StackOverflow()",&local_c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
                     ,0x6d,&gtest_dt);
  if (bVar3) {
    if (gtest_dt != (DeathTest *)0x0) {
      gtest_dt_ptr.ptr_ = gtest_dt;
      iVar4 = (*gtest_dt->_vptr_DeathTest[2])();
      pDVar2 = gtest_dt;
      if (iVar4 == 0) {
        testing::ExitedWithCode::ExitedWithCode((ExitedWithCode *)local_e0,3);
        iVar4 = (*gtest_dt->_vptr_DeathTest[3])();
        bVar3 = testing::ExitedWithCode::operator()((ExitedWithCode *)local_e0,iVar4);
        iVar4 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
        if ((char)iVar4 != '\0') goto LAB_0010c867;
        bVar3 = true;
        bVar1 = false;
      }
      else {
        if (iVar4 == 1) {
          gtest_sentinel.test_ = gtest_dt;
          bVar3 = testing::internal::AlwaysTrue();
          if (bVar3) {
            StackOverflow();
          }
          (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
        }
LAB_0010c867:
        bVar3 = false;
        bVar1 = true;
      }
      testing::internal::scoped_ptr<testing::internal::DeathTest>::~scoped_ptr(&gtest_dt_ptr);
      if (!bVar1) goto LAB_0010c87d;
    }
    bVar3 = false;
  }
  else {
    bVar3 = true;
  }
LAB_0010c87d:
  testing::internal::RE::~RE(&local_c0);
  if (!bVar3) {
    return;
  }
LAB_0010c88b:
  testing::Message::Message((Message *)&local_c0);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_e0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_recovery.cpp"
             ,0x6d,message);
  testing::internal::AssertHelper::operator=(local_e0,(Message *)&local_c0);
  testing::internal::AssertHelper::~AssertHelper(local_e0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_c0);
  return;
}

Assistant:

TEST_F (DISABLED_RecoveryTest, StackOverflowTest) {
    ASSERT_EXIT(StackOverflow(), ::testing::ExitedWithCode(CHILLOUT_EXIT_CODE), "::adfadf");
}